

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool fast_float::small_add_from<(unsigned_short)62>
               (stackvec<(unsigned_short)62> *vec,limb y,size_t start)

{
  limb *plVar1;
  ulong uVar2;
  ushort uVar3;
  limb carry;
  
  uVar3 = vec->length;
  while( true ) {
    if (y == 0) {
      return true;
    }
    if (uVar3 <= start) break;
    plVar1 = vec->data + start;
    uVar2 = *plVar1;
    *plVar1 = *plVar1 + y;
    y = (limb)CARRY8(uVar2,y);
    start = start + 1;
  }
  if (uVar3 < 0x3e) {
    vec->data[uVar3] = y;
    vec->length = uVar3 + 1;
    return true;
  }
  return false;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
bool small_add_from(stackvec<size>& vec, limb y, size_t start) noexcept {
  size_t index = start;
  limb carry = y;
  bool overflow;
  while (carry != 0 && index < vec.len()) {
    vec[index] = scalar_add(vec[index], carry, overflow);
    carry = limb(overflow);
    index += 1;
  }
  if (carry != 0) {
    FASTFLOAT_TRY(vec.try_push(carry));
  }
  return true;
}